

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepExporter.cpp
# Opt level: O2

void __thiscall
Assimp::StepExporter::StepExporter
          (StepExporter *this,aiScene *pScene,IOSystem *pIOSystem,string *path,string *file,
          ExportProperties *pProperties)

{
  _Rb_tree_header *p_Var1;
  allocator<char> aaStack_48 [8];
  string *local_40;
  locale local_38 [8];
  
  std::__cxx11::stringstream::stringstream((stringstream *)this);
  this->mProperties = pProperties;
  this->mIOSystem = pIOSystem;
  std::__cxx11::string::string((string *)&this->mFile,(string *)file);
  local_40 = &this->mFile;
  std::__cxx11::string::string((string *)&this->mPath,(string *)path);
  this->mScene = pScene;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->endstr,";\n",aaStack_48);
  p_Var1 = &(this->trafos)._M_t._M_impl.super__Rb_tree_header;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->trafos)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->meshes)._M_t._M_impl.super__Rb_tree_header;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->meshes)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  anon_unknown.dwarf_3166ab::CollectTrafos(pScene->mRootNode,&this->trafos);
  anon_unknown.dwarf_3166ab::CollectMeshes(pScene->mRootNode,&this->meshes);
  std::locale::locale((locale *)aaStack_48,"C");
  std::ios::imbue(local_38);
  std::locale::~locale(local_38);
  std::locale::~locale((locale *)aaStack_48);
  *(undefined8 *)(&this->field_0x8 + *(long *)(*(long *)this + -0x18)) = 8;
  WriteFile(this);
  return;
}

Assistant:

StepExporter::StepExporter(const aiScene* pScene, IOSystem* pIOSystem, const std::string& path,
    const std::string& file, const ExportProperties* pProperties) :
    mProperties(pProperties), mIOSystem(pIOSystem), mFile(file), mPath(path),
    mScene(pScene), endstr(";\n") {
    CollectTrafos(pScene->mRootNode, trafos);
    CollectMeshes(pScene->mRootNode, meshes);

    // make sure that all formatting happens using the standard, C locale and not the user's current locale
    mOutput.imbue(std::locale("C"));
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    // start writing
    WriteFile();
}